

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMNontrappingFPToIntLowering.cpp
# Opt level: O0

void __thiscall
wasm::LLVMNonTrappingFPToIntLowering::run(LLVMNonTrappingFPToIntLowering *this,Module *module)

{
  bool bVar1;
  FeatureSet *this_00;
  FeatureSet local_128 [4];
  unique_ptr<wasm::LLVMNonTrappingFPToIntLoweringImpl,_std::default_delete<wasm::LLVMNonTrappingFPToIntLoweringImpl>_>
  local_118;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> local_110;
  undefined1 local_108 [8];
  PassRunner runner;
  Module *module_local;
  LLVMNonTrappingFPToIntLowering *this_local;
  
  runner._232_8_ = module;
  bVar1 = FeatureSet::hasTruncSat(&module->features);
  if (bVar1) {
    PassRunner::PassRunner((PassRunner *)local_108,(Module *)runner._232_8_);
    std::make_unique<wasm::LLVMNonTrappingFPToIntLoweringImpl>();
    std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
    unique_ptr<wasm::LLVMNonTrappingFPToIntLoweringImpl,std::default_delete<wasm::LLVMNonTrappingFPToIntLoweringImpl>,void>
              ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)&local_110,&local_118);
    PassRunner::add((PassRunner *)local_108,&local_110);
    std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::~unique_ptr(&local_110);
    std::
    unique_ptr<wasm::LLVMNonTrappingFPToIntLoweringImpl,_std::default_delete<wasm::LLVMNonTrappingFPToIntLoweringImpl>_>
    ::~unique_ptr(&local_118);
    PassRunner::setIsNested((PassRunner *)local_108,true);
    PassRunner::run((PassRunner *)local_108);
    this_00 = (FeatureSet *)(runner._232_8_ + 0x178);
    FeatureSet::FeatureSet(local_128,4);
    FeatureSet::disable(this_00,local_128);
    PassRunner::~PassRunner((PassRunner *)local_108);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasTruncSat()) {
      return;
    }
    PassRunner runner(module);
    // Run the Impl pass as an inner pass in parallel. This pass updates the
    // module features, so it can't be parallel.
    runner.add(std::make_unique<LLVMNonTrappingFPToIntLoweringImpl>());
    runner.setIsNested(true);
    runner.run();
    module->features.disable(FeatureSet::TruncSat);
  }